

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcPlane::IfcPlane(IfcPlane *this)

{
  *(undefined ***)&(this->super_IfcElementarySurface).field_0x58 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x60 = 0;
  *(char **)&this->field_0x68 = "IfcPlane";
  IfcElementarySurface::IfcElementarySurface
            (&this->super_IfcElementarySurface,&PTR_construction_vtable_24__007718f8);
  (this->super_IfcElementarySurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x771818;
  *(undefined8 *)&(this->super_IfcElementarySurface).field_0x58 = 0x7718e0;
  *(undefined8 *)
   &(this->super_IfcElementarySurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x771840;
  *(undefined8 *)
   &(this->super_IfcElementarySurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x771868;
  *(undefined8 *)
   &(this->super_IfcElementarySurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
    field_0x30 = 0x771890;
  *(undefined8 *)&(this->super_IfcElementarySurface).field_0x48 = 0x7718b8;
  return;
}

Assistant:

IfcPlane() : Object("IfcPlane") {}